

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O1

int ON_SubD_ComponentIdTypeAndTag::CompareTypeAndIdAndTag
              (ON_SubD_ComponentIdTypeAndTag *lhs,ON_SubD_ComponentIdTypeAndTag *rhs)

{
  byte bVar1;
  uint uVar2;
  byte bVar3;
  
  uVar2 = CompareTypeAndId(lhs,rhs);
  if (uVar2 == 0) {
    if (lhs == (ON_SubD_ComponentIdTypeAndTag *)0x0) {
      uVar2 = 1;
    }
    else if (rhs == (ON_SubD_ComponentIdTypeAndTag *)0x0) {
      uVar2 = 0xffffffff;
    }
    else {
      bVar1 = lhs->m_tag_and_dirx & 7;
      bVar3 = rhs->m_tag_and_dirx & 7;
      uVar2 = 0xffffffff;
      if (bVar3 <= bVar1) {
        uVar2 = (uint)(bVar3 < bVar1);
      }
    }
  }
  return uVar2;
}

Assistant:

int ON_SubD_ComponentIdTypeAndTag::CompareTypeAndIdAndTag(const ON_SubD_ComponentIdTypeAndTag* lhs, const ON_SubD_ComponentIdTypeAndTag* rhs)
{
  int rc = ON_SubD_ComponentIdTypeAndTag::CompareTypeAndId(lhs, rhs);
  if (0 != rc)
    return rc;
  if (nullptr == lhs)
    return 1;
  if (nullptr == rhs)
    return -1;
  const unsigned char lhs_tag = lhs->Internal_Tag();
  const unsigned char rhs_tag = rhs->Internal_Tag();
  if (lhs_tag < rhs_tag)
    return -1;
  if (lhs_tag > rhs_tag)
    return 1;
  return 0;
}